

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-detection.c
# Opt level: O2

coda_detection_node * detection_node_new(void)

{
  coda_detection_node *pcVar1;
  
  pcVar1 = (coda_detection_node *)malloc(0x28);
  if (pcVar1 == (coda_detection_node *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-detection.c"
                   ,0xca);
  }
  else {
    pcVar1->subnode = (coda_detection_node_struct **)0x0;
    pcVar1->path = (char *)0x0;
    pcVar1->expression = (coda_expression *)0x0;
    *(undefined8 *)((long)&pcVar1->expression + 4) = 0;
    *(undefined8 *)((long)&pcVar1->rule + 4) = 0;
  }
  return pcVar1;
}

Assistant:

static coda_detection_node *detection_node_new(void)
{
    coda_detection_node *node;

    node = malloc(sizeof(coda_detection_node));
    if (node == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_detection_node), __FILE__, __LINE__);
        return NULL;
    }
    node->path = NULL;
    node->expression = NULL;
    node->rule = NULL;
    node->num_subnodes = 0;
    node->subnode = NULL;

    return node;
}